

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  ProString *pPVar1;
  QChar *pQVar2;
  char16_t *pcVar3;
  CutResult CVar4;
  char16_t *pcVar5;
  long lVar6;
  long in_FS_OFFSET;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QConcatenable<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>_>::
  appendTo<QChar>((type *)p,out);
  pPVar1 = (p->a).b;
  lVar6 = (long)pPVar1->m_length;
  if (lVar6 != 0) {
    pQVar2 = *out;
    pcVar3 = (pPVar1->m_string).d.ptr;
    local_40 = (long)pPVar1->m_offset;
    local_48 = lVar6;
    CVar4 = QtPrivate::QContainerImplHelper::mid((pPVar1->m_string).d.size,&local_40,&local_48);
    pcVar5 = (char16_t *)0x0;
    if (CVar4 != Null) {
      pcVar5 = pcVar3 + local_40;
    }
    memcpy(pQVar2,pcVar5,lVar6 * 2);
    *out = *out + lVar6;
  }
  lVar6 = (long)(p->b).m_length;
  if (lVar6 != 0) {
    pQVar2 = *out;
    pcVar3 = (p->b).m_string.d.ptr;
    local_40 = (long)(p->b).m_offset;
    local_48 = lVar6;
    CVar4 = QtPrivate::QContainerImplHelper::mid((p->b).m_string.d.size,&local_40,&local_48);
    pcVar5 = (char16_t *)0x0;
    if (CVar4 != Null) {
      pcVar5 = pcVar3 + local_40;
    }
    memcpy(pQVar2,pcVar5,lVar6 * 2);
    *out = *out + lVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }